

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O0

void math::internal::matrix_apply_householder_matrix<double>
               (double *mat_a,int rows,int cols,double *house_mat,int house_length,int offset_rows,
               int offset_cols)

{
  value_type vVar1;
  double dVar2;
  int iVar3;
  reference pvVar4;
  int local_7c;
  double dStack_78;
  int k;
  double current;
  int local_68;
  int j_1;
  int i_1;
  int j;
  int i;
  allocator<double> local_49;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> rhs;
  int house_length_n;
  int offset_rows_local;
  int house_length_local;
  double *house_mat_local;
  int cols_local;
  int rows_local;
  double *mat_a_local;
  
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = house_length + (cols - rows);
  iVar3 = house_length *
          rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  std::allocator<double>::allocator(&local_49);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_48,(long)iVar3,&local_49);
  std::allocator<double>::~allocator(&local_49);
  for (i_1 = 0; i_1 < house_length; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_; j_1 = j_1 + 1) {
      vVar1 = mat_a[(offset_rows + i_1) * cols + offset_cols + j_1];
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_48,
                          (long)(i_1 * rhs.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + j_1
                                ));
      *pvVar4 = vVar1;
    }
  }
  for (local_68 = 0; local_68 < rows - offset_rows; local_68 = local_68 + 1) {
    for (current._4_4_ = 0; current._4_4_ < cols - offset_cols; current._4_4_ = current._4_4_ + 1) {
      dStack_78 = 0.0;
      for (local_7c = 0; local_7c < house_length; local_7c = local_7c + 1) {
        dVar2 = house_mat[local_68 * house_length + local_7c];
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_48,
                            (long)(local_7c *
                                   rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._4_4_ + current._4_4_))
        ;
        dStack_78 = dVar2 * *pvVar4 + dStack_78;
      }
      mat_a[(offset_rows + local_68) * cols + offset_cols + current._4_4_] = dStack_78;
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  return;
}

Assistant:

void
matrix_apply_householder_matrix (T* mat_a, int rows, int cols,
    T const* house_mat, int house_length, int offset_rows, int offset_cols)
{
    /* Save block from old matrix that will be modified. */
    int house_length_n = house_length - (rows - cols);
    std::vector<T> rhs(house_length * house_length_n);
    for (int i = 0; i < house_length; ++i)
    {
        for (int j = 0; j < house_length_n; ++j)
        {
            rhs[i * house_length_n + j] = mat_a[(offset_rows + i) *
                cols + (offset_cols + j)];
        }
    }

    /* Multiply block matrices. */
    for (int i = 0; i < (rows - offset_rows); ++i)
    {
        for (int j = 0; j < (cols - offset_cols); ++j)
        {
            T current(0);
            for (int k = 0; k < house_length; ++k)
            {
                current += (house_mat[i * house_length + k] *
                    rhs[k * house_length_n + j]);
            }
            mat_a[(offset_rows + i) * cols + (offset_cols + j)] = current;
        }
    }
}